

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,StructSchema schema)

{
  StructBuilder builder_00;
  bool bVar1;
  StructSize size;
  StructBuilder local_b8;
  Schema local_90;
  Fault local_78;
  Fault f;
  Reader local_40;
  Schema local_10;
  StructSchema schema_local;
  
  local_10 = schema.super_Schema.raw;
  Schema::getProto((Reader *)&f,&local_10);
  capnp::schema::Node::Reader::getStruct(&local_40,(Reader *)&f);
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x761,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  local_90.raw = local_10.raw;
  size = anon_unknown_70::structSizeFromSchema((StructSchema)local_10.raw);
  PointerBuilder::getStruct(&local_b8,&builder,size,(word *)0x0);
  builder_00.capTable = local_b8.capTable;
  builder_00.segment = local_b8.segment;
  builder_00.data = local_b8.data;
  builder_00.pointers = local_b8.pointers;
  builder_00.dataSize = local_b8.dataSize;
  builder_00.pointerCount = local_b8.pointerCount;
  builder_00._38_2_ = local_b8._38_2_;
  DynamicStruct::Builder::Builder(__return_storage_ptr__,(StructSchema)local_90.raw,builder_00);
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::getDynamic(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema, builder.getStruct(
      structSizeFromSchema(schema), nullptr));
}